

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void google::protobuf::compiler::anon_unknown_5::GatherOccupiedFieldRanges
               (Descriptor *descriptor,
               btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *ranges,vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *nested_messages)

{
  int iVar1;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *pvVar2;
  int iVar3;
  ExtensionRange *pEVar4;
  ReservedRange *__a;
  ReservedRange *pRVar5;
  Descriptor *local_c0;
  Descriptor *nested_desc;
  undefined1 local_b0 [4];
  int i_3;
  pair<int,_int> local_94;
  int local_8c;
  undefined1 local_88 [4];
  int i_2;
  int local_6c;
  int local_68;
  pair<int,_int> local_64;
  int local_5c;
  undefined1 local_58 [4];
  int i_1;
  int local_40;
  int local_3c;
  pair<int,_int> local_38;
  FieldDescriptor *local_30;
  FieldDescriptor *fd;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *pvStack_20;
  int i;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *nested_messages_local;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *ranges_local;
  Descriptor *descriptor_local;
  
  fd._4_4_ = 0;
  pvStack_20 = nested_messages;
  nested_messages_local =
       (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
        *)ranges;
  ranges_local = (btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  *)descriptor;
  while( true ) {
    iVar1 = fd._4_4_;
    iVar3 = Descriptor::field_count((Descriptor *)ranges_local);
    if (iVar3 <= iVar1) break;
    local_30 = Descriptor::field((Descriptor *)ranges_local,fd._4_4_);
    pvVar2 = nested_messages_local;
    local_3c = FieldDescriptor::number(local_30);
    local_40 = FieldDescriptor::number(local_30);
    local_40 = local_40 + 1;
    std::pair<int,_int>::pair<int,_int,_true>(&local_38,&local_3c,&local_40);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)local_58,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)pvVar2,&local_38);
    fd._4_4_ = fd._4_4_ + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar1 = local_5c;
    iVar3 = Descriptor::extension_range_count((Descriptor *)ranges_local);
    pvVar2 = nested_messages_local;
    if (iVar3 <= iVar1) break;
    pEVar4 = Descriptor::extension_range((Descriptor *)ranges_local,local_5c);
    local_68 = Descriptor::ExtensionRange::start_number(pEVar4);
    pEVar4 = Descriptor::extension_range((Descriptor *)ranges_local,local_5c);
    local_6c = Descriptor::ExtensionRange::end_number(pEVar4);
    std::pair<int,_int>::pair<int,_int,_true>(&local_64,&local_68,&local_6c);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)local_88,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)pvVar2,&local_64);
    local_5c = local_5c + 1;
  }
  local_8c = 0;
  while( true ) {
    iVar1 = local_8c;
    iVar3 = Descriptor::reserved_range_count((Descriptor *)ranges_local);
    pvVar2 = nested_messages_local;
    if (iVar3 <= iVar1) break;
    __a = Descriptor::reserved_range((Descriptor *)ranges_local,local_8c);
    pRVar5 = Descriptor::reserved_range((Descriptor *)ranges_local,local_8c);
    std::pair<int,_int>::pair<int,_int,_true>(&local_94,&__a->start,&pRVar5->end);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
    ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
              *)local_b0,
             (btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_>
              *)pvVar2,&local_94);
    local_8c = local_8c + 1;
  }
  nested_desc._4_4_ = 0;
  while( true ) {
    iVar1 = nested_desc._4_4_;
    iVar3 = Descriptor::nested_type_count((Descriptor *)ranges_local);
    if (iVar3 <= iVar1) break;
    local_c0 = Descriptor::nested_type((Descriptor *)ranges_local,nested_desc._4_4_);
    std::
    vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::push_back(pvStack_20,&local_c0);
    nested_desc._4_4_ = nested_desc._4_4_ + 1;
  }
  return;
}

Assistant:

void GatherOccupiedFieldRanges(
    const Descriptor* descriptor, absl::btree_set<FieldRange>* ranges,
    std::vector<const Descriptor*>* nested_messages) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* fd = descriptor->field(i);
    ranges->insert(FieldRange(fd->number(), fd->number() + 1));
  }
  for (int i = 0; i < descriptor->extension_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->extension_range(i)->start_number(),
                              descriptor->extension_range(i)->end_number()));
  }
  for (int i = 0; i < descriptor->reserved_range_count(); ++i) {
    ranges->insert(FieldRange(descriptor->reserved_range(i)->start,
                              descriptor->reserved_range(i)->end));
  }
  // Handle the nested messages/groups in declaration order to make it
  // post-order strict.
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    const Descriptor* nested_desc = descriptor->nested_type(i);
    nested_messages->push_back(nested_desc);
  }
}